

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZCompMesh *mesh,
          TPZCompElHCurl<pzshape::TPZShapeCube> *copy)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_017810b0;
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeCube>,&PTR_PTR_0177cba0,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeCube>);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_0177c7d0;
  local_20 = -1;
  TPZManVector<long,_19>::TPZManVector(&this->fConnectIndexes,0x13,&local_20);
  this->fhcurlfam = copy->fhcurlfam;
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl(TPZCompMesh &mesh, const TPZCompElHCurl<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fhcurlfam(copy.fhcurlfam)
{

}